

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_int8.h
# Opt level: O0

void ncnn::pack_B_tile_int8(Mat *B,Mat *BT,int j,int max_jj,int k,int max_kk)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  int iVar10;
  int in_ECX;
  int in_EDX;
  undefined8 *in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  undefined1 auVar12 [16];
  undefined1 auVar11 [32];
  int kk_3;
  char *p0_3;
  int kk_2;
  char *p1;
  char *p0_2;
  __m128i _p_3;
  __m128i _p_2;
  int kk_1;
  __m128i _vindex_1;
  char *p0_1;
  __m128i _p_1;
  __m128i _p;
  int kk;
  __m256i _vindex;
  char *p0;
  int jj;
  char *pp;
  __m256i _t;
  __m128i _si;
  __m256i _t_1;
  __m128i _si_1;
  __m128i _si_2;
  __m128i _si_3;
  int in_stack_fffffffffffff820;
  int in_stack_fffffffffffff824;
  int in_stack_fffffffffffff828;
  int in_stack_fffffffffffff82c;
  undefined4 in_stack_fffffffffffff830;
  undefined1 in_stack_fffffffffffff834;
  undefined1 in_stack_fffffffffffff835;
  undefined1 in_stack_fffffffffffff836;
  undefined1 in_stack_fffffffffffff837;
  undefined4 in_stack_fffffffffffff838;
  undefined4 in_stack_fffffffffffff83c;
  undefined1 *local_7c0;
  int local_7b4;
  undefined1 *local_7b0;
  undefined1 *local_7a8;
  undefined8 local_790;
  int local_774;
  undefined8 local_750;
  int local_724;
  int local_6e4;
  undefined8 *local_6e0;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined4 local_430;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  
  iVar10 = cpu_support_x86_avx_vnni_int8();
  if (iVar10 == 0) {
    iVar10 = cpu_support_x86_avx_vnni();
    if (iVar10 == 0) {
      local_6e0 = (undefined8 *)*in_RSI;
      for (local_6e4 = 0; local_6e4 + 7 < in_ECX; local_6e4 = local_6e4 + 8) {
        auVar2 = vpinsrd_avx(ZEXT416(0),1,1);
        auVar2 = vpinsrd_avx(auVar2,2,2);
        auVar2 = vpinsrd_avx(auVar2,3,3);
        auVar3 = vpinsrd_avx(ZEXT416(4),5,1);
        auVar3 = vpinsrd_avx(auVar3,6,2);
        auVar3 = vpinsrd_avx(auVar3,7,3);
        uStack_330 = auVar3._0_8_;
        uStack_328 = auVar3._8_8_;
        uVar1 = *(uint *)((long)in_RDI + 0x2c);
        auVar3 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
        auVar3 = vpinsrd_avx(auVar3,uVar1,2);
        auVar3 = vpinsrd_avx(auVar3,uVar1,3);
        auVar4 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
        auVar4 = vpinsrd_avx(auVar4,uVar1,2);
        auVar4 = vpinsrd_avx(auVar4,uVar1,3);
        auVar12 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar3;
        uStack_3f0 = auVar12._0_8_;
        uStack_3e8 = auVar12._8_8_;
        auVar5._16_8_ = uStack_330;
        auVar5._0_16_ = auVar2;
        auVar5._24_8_ = uStack_328;
        auVar11._16_8_ = uStack_3f0;
        auVar11._0_16_ = ZEXT116(0) * auVar3 + ZEXT116(1) * auVar4;
        auVar11._24_8_ = uStack_3e8;
        vpmulld_avx2(auVar5,auVar11);
        for (local_724 = 0; local_724 + 1 < in_R9D; local_724 = local_724 + 2) {
          auVar2 = vpinsrd_avx(ZEXT416(0xffffffff),0xffffffff,1);
          auVar2 = vpinsrd_avx(auVar2,0xffffffff,2);
          auVar2 = vpinsrd_avx(auVar2,0xffffffff,3);
          auVar3 = vpinsrd_avx(ZEXT416(0xffffffff),0xffffffff,1);
          auVar3 = vpinsrd_avx(auVar3,0xffffffff,2);
          auVar3 = vpinsrd_avx(auVar3,0xffffffff,3);
          auVar6._16_16_ = auVar3;
          auVar6._0_16_ = auVar2;
          auVar11 = vpgatherdd(ZEXT1632(ZEXT816(0) << 0x40),auVar6);
          auVar2 = vpinsrb_avx(ZEXT116(0),1,1);
          auVar2 = vpinsrb_avx(auVar2,4,2);
          auVar2 = vpinsrb_avx(auVar2,5,3);
          auVar2 = vpinsrb_avx(auVar2,8,4);
          auVar2 = vpinsrb_avx(auVar2,9,5);
          auVar2 = vpinsrb_avx(auVar2,0xc,6);
          auVar2 = vpinsrb_avx(auVar2,0xd,7);
          auVar2 = vpinsrb_avx(auVar2,0,8);
          auVar2 = vpinsrb_avx(auVar2,0,9);
          auVar2 = vpinsrb_avx(auVar2,0,10);
          auVar2 = vpinsrb_avx(auVar2,0,0xb);
          auVar2 = vpinsrb_avx(auVar2,0,0xc);
          auVar2 = vpinsrb_avx(auVar2,0,0xd);
          auVar2 = vpinsrb_avx(auVar2,0,0xe);
          auVar2 = vpinsrb_avx(auVar2,0,0xf);
          local_1c0 = auVar2._0_8_;
          uStack_1b8 = auVar2._8_8_;
          auVar9._16_8_ = local_1c0;
          auVar9._0_16_ = auVar2;
          auVar9._24_8_ = uStack_1b8;
          auVar11 = vpshufb_avx2(auVar11,auVar9);
          auVar11 = vpermq_avx2(auVar11,0xd8);
          local_5e0 = auVar11._0_8_;
          uStack_5d8 = auVar11._8_8_;
          *local_6e0 = local_5e0;
          local_6e0[1] = uStack_5d8;
          local_6e0 = local_6e0 + 2;
        }
        for (; local_724 < in_R9D; local_724 = local_724 + 1) {
          auVar2 = vpinsrd_avx(ZEXT416(0xffffffff),0xffffffff,1);
          auVar2 = vpinsrd_avx(auVar2,0xffffffff,2);
          auVar2 = vpinsrd_avx(auVar2,0xffffffff,3);
          auVar3 = vpinsrd_avx(ZEXT416(0xffffffff),0xffffffff,1);
          auVar3 = vpinsrd_avx(auVar3,0xffffffff,2);
          auVar3 = vpinsrd_avx(auVar3,0xffffffff,3);
          auVar7._16_16_ = auVar3;
          auVar7._0_16_ = auVar2;
          auVar11 = vpgatherdd(ZEXT1632(ZEXT816(0) << 0x40),auVar7);
          auVar2 = vpinsrb_avx(ZEXT116(0),4,1);
          auVar2 = vpinsrb_avx(auVar2,8,2);
          auVar2 = vpinsrb_avx(auVar2,0xc,3);
          auVar2 = vpinsrb_avx(auVar2,0,4);
          auVar2 = vpinsrb_avx(auVar2,0,5);
          auVar2 = vpinsrb_avx(auVar2,0,6);
          auVar2 = vpinsrb_avx(auVar2,0,7);
          auVar2 = vpinsrb_avx(auVar2,0,8);
          auVar2 = vpinsrb_avx(auVar2,0,9);
          auVar2 = vpinsrb_avx(auVar2,0,10);
          auVar2 = vpinsrb_avx(auVar2,0,0xb);
          auVar2 = vpinsrb_avx(auVar2,0,0xc);
          auVar2 = vpinsrb_avx(auVar2,0,0xd);
          auVar2 = vpinsrb_avx(auVar2,0,0xe);
          auVar2 = vpinsrb_avx(auVar2,0,0xf);
          local_1a0 = auVar2._0_8_;
          uStack_198 = auVar2._8_8_;
          auVar8._16_8_ = local_1a0;
          auVar8._0_16_ = auVar2;
          auVar8._24_8_ = uStack_198;
          auVar11 = vpshufb_avx2(auVar11,auVar8);
          auVar11 = vpermq_avx2(auVar11,0xd8);
          auVar2 = vpshufd_avx(auVar11._0_16_,0xd8);
          local_750 = auVar2._0_8_;
          *local_6e0 = local_750;
          local_6e0 = local_6e0 + 1;
        }
      }
      for (; local_6e4 + 3 < in_ECX; local_6e4 = local_6e4 + 4) {
        auVar2 = vpinsrd_avx(ZEXT416(0),1,1);
        auVar2 = vpinsrd_avx(auVar2,2,2);
        auVar2 = vpinsrd_avx(auVar2,3,3);
        uVar1 = *(uint *)((long)in_RDI + 0x2c);
        auVar3 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
        auVar3 = vpinsrd_avx(auVar3,uVar1,2);
        auVar3 = vpinsrd_avx(auVar3,uVar1,3);
        vpmulld_avx(auVar2,auVar3);
        for (local_774 = 0; local_774 + 1 < in_R9D; local_774 = local_774 + 2) {
          auVar2 = vpinsrd_avx(ZEXT416(0xffffffff),0xffffffff,1);
          auVar2 = vpinsrd_avx(auVar2,0xffffffff,2);
          auVar2 = vpinsrd_avx(auVar2,0xffffffff,3);
          auVar3 = vpgatherdd(ZEXT816(0) << 0x40,auVar2);
          auVar2 = vpinsrb_avx(ZEXT116(0),1,1);
          auVar2 = vpinsrb_avx(auVar2,4,2);
          auVar2 = vpinsrb_avx(auVar2,5,3);
          auVar2 = vpinsrb_avx(auVar2,8,4);
          auVar2 = vpinsrb_avx(auVar2,9,5);
          auVar2 = vpinsrb_avx(auVar2,0xc,6);
          auVar2 = vpinsrb_avx(auVar2,0xd,7);
          auVar2 = vpinsrb_avx(auVar2,0,8);
          auVar2 = vpinsrb_avx(auVar2,0,9);
          auVar2 = vpinsrb_avx(auVar2,0,10);
          auVar2 = vpinsrb_avx(auVar2,0,0xb);
          auVar2 = vpinsrb_avx(auVar2,0,0xc);
          auVar2 = vpinsrb_avx(auVar2,0,0xd);
          auVar2 = vpinsrb_avx(auVar2,0,0xe);
          auVar2 = vpinsrb_avx(auVar2,0,0xf);
          auVar2 = vpshufb_avx(auVar3,auVar2);
          local_790 = auVar2._0_8_;
          *local_6e0 = local_790;
          local_6e0 = local_6e0 + 1;
        }
        for (; local_774 < in_R9D; local_774 = local_774 + 1) {
          auVar2 = vpinsrd_avx(ZEXT416(0xffffffff),0xffffffff,1);
          auVar2 = vpinsrd_avx(auVar2,0xffffffff,2);
          auVar2 = vpinsrd_avx(auVar2,0xffffffff,3);
          auVar3 = vpgatherdd(ZEXT816(0) << 0x40,auVar2);
          auVar2 = vpinsrb_avx(ZEXT116(0),4,1);
          auVar2 = vpinsrb_avx(auVar2,8,2);
          auVar2 = vpinsrb_avx(auVar2,0xc,3);
          auVar2 = vpinsrb_avx(auVar2,0,4);
          auVar2 = vpinsrb_avx(auVar2,0,5);
          auVar2 = vpinsrb_avx(auVar2,0,6);
          auVar2 = vpinsrb_avx(auVar2,0,7);
          auVar2 = vpinsrb_avx(auVar2,0,8);
          auVar2 = vpinsrb_avx(auVar2,0,9);
          auVar2 = vpinsrb_avx(auVar2,0,10);
          auVar2 = vpinsrb_avx(auVar2,0,0xb);
          auVar2 = vpinsrb_avx(auVar2,0,0xc);
          auVar2 = vpinsrb_avx(auVar2,0,0xd);
          auVar2 = vpinsrb_avx(auVar2,0,0xe);
          auVar2 = vpinsrb_avx(auVar2,0,0xf);
          auVar2 = vpshufb_avx(auVar3,auVar2);
          local_430 = auVar2._0_4_;
          *(undefined4 *)local_6e0 = local_430;
          local_6e0 = (undefined8 *)((long)local_6e0 + 4);
        }
      }
      for (; local_6e4 + 1 < in_ECX; local_6e4 = local_6e4 + 2) {
        local_7a8 = (undefined1 *)
                    (*in_RDI + (long)*(int *)((long)in_RDI + 0x2c) * (long)(in_EDX + local_6e4) *
                               in_RDI[2] + (long)in_R8D);
        local_7b0 = (undefined1 *)
                    (*in_RDI + (long)*(int *)((long)in_RDI + 0x2c) * (long)(in_EDX + local_6e4 + 1)
                               * in_RDI[2] + (long)in_R8D);
        for (local_7b4 = 0; local_7b4 + 1 < in_R9D; local_7b4 = local_7b4 + 2) {
          *(undefined1 *)local_6e0 = *local_7a8;
          *(undefined1 *)((long)local_6e0 + 1) = local_7a8[1];
          *(undefined1 *)((long)local_6e0 + 2) = *local_7b0;
          *(undefined1 *)((long)local_6e0 + 3) = local_7b0[1];
          local_6e0 = (undefined8 *)((long)local_6e0 + 4);
          local_7a8 = local_7a8 + 2;
          local_7b0 = local_7b0 + 2;
        }
        for (; local_7b4 < in_R9D; local_7b4 = local_7b4 + 1) {
          *(undefined1 *)local_6e0 = *local_7a8;
          *(undefined1 *)((long)local_6e0 + 1) = *local_7b0;
          local_6e0 = (undefined8 *)((long)local_6e0 + 2);
          local_7a8 = local_7a8 + 1;
          local_7b0 = local_7b0 + 1;
        }
      }
      for (; local_6e4 < in_ECX; local_6e4 = local_6e4 + 1) {
        local_7c0 = (undefined1 *)
                    (*in_RDI + (long)*(int *)((long)in_RDI + 0x2c) * (long)(in_EDX + local_6e4) *
                               in_RDI[2] + (long)in_R8D);
        for (iVar10 = 0; iVar10 < in_R9D; iVar10 = iVar10 + 1) {
          *(undefined1 *)local_6e0 = *local_7c0;
          local_6e0 = (undefined8 *)((long)local_6e0 + 1);
          local_7c0 = local_7c0 + 1;
        }
      }
    }
    else {
      pack_B_tile_int8_avxvnni
                ((Mat *)CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838),
                 (Mat *)CONCAT17(in_stack_fffffffffffff837,
                                 CONCAT16(in_stack_fffffffffffff836,
                                          CONCAT15(in_stack_fffffffffffff835,
                                                   CONCAT14(in_stack_fffffffffffff834,
                                                            in_stack_fffffffffffff830)))),
                 in_stack_fffffffffffff82c,in_stack_fffffffffffff828,in_stack_fffffffffffff824,
                 in_stack_fffffffffffff820);
    }
  }
  else {
    pack_B_tile_int8_avxvnniint8
              ((Mat *)CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838),
               (Mat *)CONCAT17(in_stack_fffffffffffff837,
                               CONCAT16(in_stack_fffffffffffff836,
                                        CONCAT15(in_stack_fffffffffffff835,
                                                 CONCAT14(in_stack_fffffffffffff834,
                                                          in_stack_fffffffffffff830)))),
               in_stack_fffffffffffff82c,in_stack_fffffffffffff828,in_stack_fffffffffffff824,
               in_stack_fffffffffffff820);
  }
  return;
}

Assistant:

static void pack_B_tile_int8(const Mat& B, Mat& BT, int j, int max_jj, int k, int max_kk)
{
#if NCNN_RUNTIME_CPU && NCNN_AVX512VNNI && __AVX512F__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx512_vnni())
    {
        pack_B_tile_int8_avx512vnni(B, BT, j, max_jj, k, max_kk);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVXVNNIINT8 && __AVX__ && !__AVXVNNIINT8__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx_vnni_int8())
    {
        pack_B_tile_int8_avxvnniint8(B, BT, j, max_jj, k, max_kk);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVXVNNI && __AVX__ && !__AVXVNNI__ && !__AVXVNNIINT8__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx_vnni())
    {
        pack_B_tile_int8_avxvnni(B, BT, j, max_jj, k, max_kk);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVX2 && __AVX__ && !__AVX2__ && !__AVXVNNI__ && !__AVXVNNIINT8__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx2())
    {
        pack_B_tile_int8_avx2(B, BT, j, max_jj, k, max_kk);
        return;
    }
#endif

    // NCNN_LOGE("pack_B_tile_int8");
    // assert B.elempack == 1
    // assert B.dims == 2

    signed char* pp = BT;

    int jj = 0;
#if __SSE2__
#if defined(__x86_64__) || defined(_M_X64)
#if __AVX512F__
    for (; jj + 15 < max_jj; jj += 16)
    {
        const signed char* p0 = B.row<const signed char>(j + jj) + k;

        __m512i _vindex = _mm512_setr_epi32(0, 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15);
        _vindex = _mm512_mullo_epi32(_vindex, _mm512_set1_epi32(B.w));

        int kk = 0;
#if __AVX512VNNI__
        __m512i _v127 = _mm512_set1_epi8(127);
        for (; kk + 3 < max_kk; kk += 4)
        {
            __m512i _p = _mm512_i32gather_epi32(_vindex, p0, sizeof(signed char));
            _p = _mm512_add_epi8(_p, _v127);
            _mm512_storeu_si512((__m512i*)pp, _p);
            pp += 64;
            p0 += 4;
        }
#endif // __AVX512VNNI__
        for (; kk + 1 < max_kk; kk += 2)
        {
            __m256i _p = _mm512_cvtepi32_epi16(_mm512_i32gather_epi32(_vindex, p0, sizeof(signed char)));
            _mm256_storeu_si256((__m256i*)pp, _p);
            pp += 32;
            p0 += 2;
        }
        for (; kk < max_kk; kk++)
        {
            __m128i _p = _mm512_cvtepi32_epi8(_mm512_i32gather_epi32(_vindex, p0, sizeof(signed char)));
            _mm_store_si128((__m128i*)pp, _p);
            pp += 16;
            p0++;
        }
    }
#endif // __AVX512F__
    for (; jj + 7 < max_jj; jj += 8)
    {
        const signed char* p0 = B.row<const signed char>(j + jj) + k;

#if __AVX2__
        __m256i _vindex = _mm256_setr_epi32(0, 1, 2, 3, 4, 5, 6, 7);
        _vindex = _mm256_mullo_epi32(_vindex, _mm256_set1_epi32(B.w));
#else
        const signed char* p1 = B.row<const signed char>(j + jj + 1) + k;
        const signed char* p2 = B.row<const signed char>(j + jj + 2) + k;
        const signed char* p3 = B.row<const signed char>(j + jj + 3) + k;
        const signed char* p4 = B.row<const signed char>(j + jj + 4) + k;
        const signed char* p5 = B.row<const signed char>(j + jj + 5) + k;
        const signed char* p6 = B.row<const signed char>(j + jj + 6) + k;
        const signed char* p7 = B.row<const signed char>(j + jj + 7) + k;
#endif // __AVX2__

        int kk = 0;
#if __AVX512VNNI__ || __AVXVNNI__
#if __AVXVNNIINT8__
        for (; kk + 3 < max_kk; kk += 4)
        {
            __m256i _p = _mm256_i32gather_epi32((const int*)p0, _vindex, sizeof(signed char));
            _mm256_storeu_si256((__m256i*)pp, _p);
            pp += 32;
            p0 += 4;
        }
#else  // __AVXVNNIINT8__
        __m256i _v127 = _mm256_set1_epi8(127);
        for (; kk + 3 < max_kk; kk += 4)
        {
            __m256i _p = _mm256_i32gather_epi32((const int*)p0, _vindex, sizeof(signed char));
            _p = _mm256_add_epi8(_p, _v127);
            _mm256_storeu_si256((__m256i*)pp, _p);
            pp += 32;
            p0 += 4;
        }
#endif // __AVXVNNIINT8__
#endif // __AVX512VNNI__ || __AVXVNNI__
        for (; kk + 1 < max_kk; kk += 2)
        {
#if __AVX2__
            __m128i _p = _mm256_comp_cvtepi32_epi16(_mm256_i32gather_epi32((const int*)p0, _vindex, sizeof(signed char)));
#if __AVX512F__
            _mm_store_si128((__m128i*)pp, _p);
#else
            _mm_storeu_si128((__m128i*)pp, _p);
#endif
            pp += 16;
            p0 += 2;
#else
            pp[0] = p0[0];
            pp[1] = p0[1];
            pp[2] = p1[0];
            pp[3] = p1[1];
            pp[4] = p2[0];
            pp[5] = p2[1];
            pp[6] = p3[0];
            pp[7] = p3[1];
            pp[8] = p4[0];
            pp[9] = p4[1];
            pp[10] = p5[0];
            pp[11] = p5[1];
            pp[12] = p6[0];
            pp[13] = p6[1];
            pp[14] = p7[0];
            pp[15] = p7[1];
            pp += 16;
            p0 += 2;
            p1 += 2;
            p2 += 2;
            p3 += 2;
            p4 += 2;
            p5 += 2;
            p6 += 2;
            p7 += 2;
#endif // __AVX2__
        }
        for (; kk < max_kk; kk++)
        {
#if __AVX2__
            __m128i _p = _mm256_comp_cvtepi32_epi8(_mm256_i32gather_epi32((const int*)p0, _vindex, sizeof(signed char)));
            _mm_storel_epi64((__m128i*)pp, _p);
            pp += 8;
            p0++;
#else
            pp[0] = p0[0];
            pp[1] = p1[0];
            pp[2] = p2[0];
            pp[3] = p3[0];
            pp[4] = p4[0];
            pp[5] = p5[0];
            pp[6] = p6[0];
            pp[7] = p7[0];
            pp += 8;
            p0++;
            p1++;
            p2++;
            p3++;
            p4++;
            p5++;
            p6++;
            p7++;
#endif // __AVX2__
        }
    }
#endif // defined(__x86_64__) || defined(_M_X64)
    for (; jj + 3 < max_jj; jj += 4)
    {
        const signed char* p0 = B.row<const signed char>(j + jj) + k;

#if __AVX2__
        __m128i _vindex = _mm_setr_epi32(0, 1, 2, 3);
        _vindex = _mm_mullo_epi32(_vindex, _mm_set1_epi32(B.w));
#else
        const signed char* p1 = B.row<const signed char>(j + jj + 1) + k;
        const signed char* p2 = B.row<const signed char>(j + jj + 2) + k;
        const signed char* p3 = B.row<const signed char>(j + jj + 3) + k;
#endif // __AVX2__

        int kk = 0;
#if __AVX512VNNI__ || __AVXVNNI__
#if __AVXVNNIINT8__
        for (; kk + 3 < max_kk; kk += 4)
        {
            __m128i _p = _mm_i32gather_epi32((const int*)p0, _vindex, sizeof(signed char));
            _mm_storeu_si128((__m128i*)pp, _p);
            pp += 16;
            p0 += 4;
        }
#else  // __AVXVNNIINT8__
        __m128i _v127 = _mm_set1_epi8(127);
        for (; kk + 3 < max_kk; kk += 4)
        {
            __m128i _p = _mm_i32gather_epi32((const int*)p0, _vindex, sizeof(signed char));
            _p = _mm_add_epi8(_p, _v127);
            _mm_storeu_si128((__m128i*)pp, _p);
            pp += 16;
            p0 += 4;
        }
#endif // __AVXVNNIINT8__
#endif // __AVX512VNNI__ || __AVXVNNI__
        for (; kk + 1 < max_kk; kk += 2)
        {
#if __AVX2__
            __m128i _p = _mm_comp_cvtepi32_epi16(_mm_i32gather_epi32((const int*)p0, _vindex, sizeof(signed char)));
            _mm_storel_epi64((__m128i*)pp, _p);
            pp += 8;
            p0 += 2;
#else
            pp[0] = p0[0];
            pp[1] = p0[1];
            pp[2] = p1[0];
            pp[3] = p1[1];
            pp[4] = p2[0];
            pp[5] = p2[1];
            pp[6] = p3[0];
            pp[7] = p3[1];
            pp += 8;
            p0 += 2;
            p1 += 2;
            p2 += 2;
            p3 += 2;
#endif // __AVX2__
        }
        for (; kk < max_kk; kk++)
        {
#if __AVX2__
            __m128i _p = _mm_comp_cvtepi32_epi8(_mm_i32gather_epi32((const int*)p0, _vindex, sizeof(signed char)));
            _mm_store_ss((float*)pp, _mm_castsi128_ps(_p));
            pp += 4;
            p0++;
#else
            pp[0] = p0[0];
            pp[1] = p1[0];
            pp[2] = p2[0];
            pp[3] = p3[0];
            pp += 4;
            p0++;
            p1++;
            p2++;
            p3++;
#endif // __AVX2__
        }
    }
#endif // __SSE2__
    for (; jj + 1 < max_jj; jj += 2)
    {
        const signed char* p0 = B.row<const signed char>(j + jj) + k;
        const signed char* p1 = B.row<const signed char>(j + jj + 1) + k;

        int kk = 0;
#if __SSE2__
#if __AVX512VNNI__ || __AVXVNNI__
#if __AVXVNNIINT8__
        for (; kk + 3 < max_kk; kk += 4)
        {
            pp[0] = p0[0];
            pp[1] = p0[1];
            pp[2] = p0[2];
            pp[3] = p0[3];
            pp[4] = p1[0];
            pp[5] = p1[1];
            pp[6] = p1[2];
            pp[7] = p1[3];
            pp += 8;
            p0 += 4;
            p1 += 4;
        }
#else  // __AVXVNNIINT8__
        for (; kk + 3 < max_kk; kk += 4)
        {
            pp[0] = p0[0] + 127;
            pp[1] = p0[1] + 127;
            pp[2] = p0[2] + 127;
            pp[3] = p0[3] + 127;
            pp[4] = p1[0] + 127;
            pp[5] = p1[1] + 127;
            pp[6] = p1[2] + 127;
            pp[7] = p1[3] + 127;
            pp += 8;
            p0 += 4;
            p1 += 4;
        }
#endif // __AVXVNNIINT8__
#endif // __AVX512VNNI__ || __AVXVNNI__
        for (; kk + 1 < max_kk; kk += 2)
        {
            pp[0] = p0[0];
            pp[1] = p0[1];
            pp[2] = p1[0];
            pp[3] = p1[1];
            pp += 4;
            p0 += 2;
            p1 += 2;
        }
#endif // __SSE2__
        for (; kk < max_kk; kk++)
        {
            pp[0] = p0[0];
            pp[1] = p1[0];
            pp += 2;
            p0++;
            p1++;
        }
    }
    for (; jj < max_jj; jj += 1)
    {
        const signed char* p0 = B.row<const signed char>(j + jj) + k;

        int kk = 0;
#if __AVX512VNNI__ || __AVXVNNI__
#if __AVXVNNIINT8__
        for (; kk + 3 < max_kk; kk += 4)
        {
            pp[0] = p0[0];
            pp[1] = p0[1];
            pp[2] = p0[2];
            pp[3] = p0[3];
            pp += 4;
            p0 += 4;
        }
#else  // __AVXVNNIINT8__
        for (; kk + 3 < max_kk; kk += 4)
        {
            pp[0] = p0[0] + 127;
            pp[1] = p0[1] + 127;
            pp[2] = p0[2] + 127;
            pp[3] = p0[3] + 127;
            pp += 4;
            p0 += 4;
        }
#endif // __AVXVNNIINT8__
#endif // __AVX512VNNI__ || __AVXVNNI__
        for (; kk < max_kk; kk++)
        {
            pp[0] = p0[0];
            pp += 1;
            p0++;
        }
    }
}